

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O0

int next_code(archive_read_filter *self)

{
  undefined1 uVar1;
  void *pvVar2;
  undefined1 *puVar3;
  int iVar4;
  ulong uVar5;
  int local_2c;
  int skip_bytes;
  int newcode;
  int code;
  private_data_conflict *state;
  archive_read_filter *self_local;
  
  pvVar2 = self->data;
  self_local._4_4_ = getbits(self,*(int *)((long)pvVar2 + 0x4c));
  if (-1 < self_local._4_4_) {
    uVar5 = (ulong)next_code::debug_index;
    next_code::debug_index = next_code::debug_index + 1;
    next_code::debug_buff[uVar5] = self_local._4_4_;
    if (0x3ff < next_code::debug_index) {
      next_code::debug_index = 0;
    }
    if ((self_local._4_4_ == 0x100) && (*(int *)((long)pvVar2 + 0x38) != 0)) {
      *(undefined4 *)((long)pvVar2 + 0x1c) = 0;
      local_2c = (*(int *)((long)pvVar2 + 0x4c) -
                 (int)(*(ulong *)((long)pvVar2 + 0x20) % (ulong)(long)*(int *)((long)pvVar2 + 0x4c))
                 ) % *(int *)((long)pvVar2 + 0x4c);
      do {
        if (local_2c < 1) {
          *(undefined8 *)((long)pvVar2 + 0x20) = 0;
          *(undefined4 *)((long)pvVar2 + 0x4c) = 9;
          *(int *)((long)pvVar2 + 0x48) =
               (1 << ((byte)*(undefined4 *)((long)pvVar2 + 0x4c) & 0x1f)) + -1;
          *(undefined4 *)((long)pvVar2 + 0x58) = 0x101;
          *(undefined4 *)((long)pvVar2 + 0x50) = 0xffffffff;
          iVar4 = next_code(self);
          return iVar4;
        }
        self_local._4_4_ = getbits(self,8);
        local_2c = local_2c + -1;
      } while (-1 < self_local._4_4_);
    }
    else if (*(int *)((long)pvVar2 + 0x58) < self_local._4_4_) {
      archive_set_error(&self->archive->archive,-1,"Invalid compressed data");
      self_local._4_4_ = -0x1e;
    }
    else {
      skip_bytes = self_local._4_4_;
      if (*(int *)((long)pvVar2 + 0x58) <= self_local._4_4_) {
        puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
        *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
        *puVar3 = (char)*(undefined4 *)((long)pvVar2 + 0x54);
        skip_bytes = *(int *)((long)pvVar2 + 0x50);
      }
      for (; 0xff < skip_bytes;
          skip_bytes = (uint)*(ushort *)((long)pvVar2 + (long)skip_bytes * 2 + 0x1005c)) {
        uVar1 = *(undefined1 *)((long)pvVar2 + (long)skip_bytes + 0x5c);
        puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
        *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
        *puVar3 = uVar1;
      }
      *(int *)((long)pvVar2 + 0x54) = skip_bytes;
      puVar3 = *(undefined1 **)((long)pvVar2 + 0x30060);
      *(undefined1 **)((long)pvVar2 + 0x30060) = puVar3 + 1;
      *puVar3 = (char)skip_bytes;
      iVar4 = *(int *)((long)pvVar2 + 0x58);
      if ((iVar4 < *(int *)((long)pvVar2 + 0x40)) && (-1 < *(int *)((long)pvVar2 + 0x50))) {
        *(short *)((long)pvVar2 + (long)iVar4 * 2 + 0x1005c) =
             (short)*(undefined4 *)((long)pvVar2 + 0x50);
        *(char *)((long)pvVar2 + (long)iVar4 + 0x5c) = (char)*(undefined4 *)((long)pvVar2 + 0x54);
        *(int *)((long)pvVar2 + 0x58) = *(int *)((long)pvVar2 + 0x58) + 1;
      }
      if (*(int *)((long)pvVar2 + 0x48) < *(int *)((long)pvVar2 + 0x58)) {
        *(int *)((long)pvVar2 + 0x4c) = *(int *)((long)pvVar2 + 0x4c) + 1;
        *(undefined8 *)((long)pvVar2 + 0x20) = 0;
        if (*(int *)((long)pvVar2 + 0x4c) == *(int *)((long)pvVar2 + 0x44)) {
          *(undefined4 *)((long)pvVar2 + 0x48) = *(undefined4 *)((long)pvVar2 + 0x40);
        }
        else {
          *(int *)((long)pvVar2 + 0x48) =
               (1 << ((byte)*(undefined4 *)((long)pvVar2 + 0x4c) & 0x1f)) + -1;
        }
      }
      *(int *)((long)pvVar2 + 0x50) = self_local._4_4_;
      self_local._4_4_ = 0;
    }
  }
  return self_local._4_4_;
}

Assistant:

static int
next_code(struct archive_read_filter *self)
{
	struct private_data *state = (struct private_data *)self->data;
	int code, newcode;

	static int debug_buff[1024];
	static unsigned debug_index;

	code = newcode = getbits(self, state->bits);
	if (code < 0)
		return (code);

	debug_buff[debug_index++] = code;
	if (debug_index >= sizeof(debug_buff)/sizeof(debug_buff[0]))
		debug_index = 0;

	/* If it's a reset code, reset the dictionary. */
	if ((code == 256) && state->use_reset_code) {
		/*
		 * The original 'compress' implementation blocked its
		 * I/O in a manner that resulted in junk bytes being
		 * inserted after every reset.  The next section skips
		 * this junk.  (Yes, the number of *bytes* to skip is
		 * a function of the current *bit* length.)
		 */
		int skip_bytes =  state->bits -
		    (state->bytes_in_section % state->bits);
		skip_bytes %= state->bits;
		state->bits_avail = 0; /* Discard rest of this byte. */
		while (skip_bytes-- > 0) {
			code = getbits(self, 8);
			if (code < 0)
				return (code);
		}
		/* Now, actually do the reset. */
		state->bytes_in_section = 0;
		state->bits = 9;
		state->section_end_code = (1 << state->bits) - 1;
		state->free_ent = 257;
		state->oldcode = -1;
		return (next_code(self));
	}

	if (code > state->free_ent) {
		/* An invalid code is a fatal error. */
		archive_set_error(&(self->archive->archive), -1,
		    "Invalid compressed data");
		return (ARCHIVE_FATAL);
	}

	/* Special case for KwKwK string. */
	if (code >= state->free_ent) {
		*state->stackp++ = state->finbyte;
		code = state->oldcode;
	}

	/* Generate output characters in reverse order. */
	while (code >= 256) {
		*state->stackp++ = state->suffix[code];
		code = state->prefix[code];
	}
	*state->stackp++ = state->finbyte = code;

	/* Generate the new entry. */
	code = state->free_ent;
	if (code < state->maxcode && state->oldcode >= 0) {
		state->prefix[code] = state->oldcode;
		state->suffix[code] = state->finbyte;
		++state->free_ent;
	}
	if (state->free_ent > state->section_end_code) {
		state->bits++;
		state->bytes_in_section = 0;
		if (state->bits == state->maxcode_bits)
			state->section_end_code = state->maxcode;
		else
			state->section_end_code = (1 << state->bits) - 1;
	}

	/* Remember previous code. */
	state->oldcode = newcode;
	return (ARCHIVE_OK);
}